

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_test.cc
# Opt level: O2

string * __thiscall re2::DeBruijnString_abi_cxx11_(string *__return_storage_ptr__,re2 *this,int n)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  size_type sVar4;
  bool bVar5;
  reference rVar6;
  vector<bool,_std::allocator<bool>_> did;
  LogMessageFatal local_1b0;
  
  std::vector<bool,_std::allocator<bool>_>::vector(&did,0x40000,(allocator_type *)&local_1b0);
  for (sVar4 = 0; sVar4 != 0x40000; sVar4 = sVar4 + 1) {
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](&did,sVar4);
    *rVar6._M_p = *rVar6._M_p & ~rVar6._M_mask;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = 0x11;
  while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  uVar2 = 0;
  iVar1 = 0x40000;
  while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
    uVar3 = uVar2 * 2 & 0x3fffe;
    uVar2 = uVar3 + 1;
    sVar4 = (size_type)uVar2;
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](&did,sVar4);
    if ((*rVar6._M_p & rVar6._M_mask) == 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      sVar4 = (size_type)uVar3;
      uVar2 = uVar3;
    }
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](&did,sVar4);
    if ((*rVar6._M_p & rVar6._M_mask) != 0) {
      LogMessageFatal::LogMessageFatal
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
                 ,0xa0);
      std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"Check failed: !did[bits]");
      LogMessageFatal::~LogMessageFatal(&local_1b0);
    }
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](&did,sVar4);
    *rVar6._M_p = *rVar6._M_p | rVar6._M_mask;
  }
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&did.super__Bvector_base<std::allocator<bool>_>);
  return __return_storage_ptr__;
}

Assistant:

static string DeBruijnString(int n) {
  CHECK_LT(n, static_cast<int>(8*sizeof(int)));
  CHECK_GT(n, 0);

  vector<bool> did(1<<n);
  for (int i = 0; i < 1<<n; i++)
    did[i] = false;

  string s;
  for (int i = 0; i < n-1; i++)
    s.append("0");
  int bits = 0;
  int mask = (1<<n) - 1;
  for (int i = 0; i < (1<<n); i++) {
    bits <<= 1;
    bits &= mask;
    if (!did[bits|1]) {
      bits |= 1;
      s.append("1");
    } else {
      s.append("0");
    }
    CHECK(!did[bits]);
    did[bits] = true;
  }
  return s;
}